

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O3

void skiwi::inline_is_procedure(asmcode *code,compiler_options *param_2)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  string lab_false;
  string done;
  string check_closure;
  operand local_88 [2];
  operation local_80 [3];
  operand local_74;
  string local_70;
  string local_50;
  string local_30;
  
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_50,psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_30,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_70,psVar1,lab_00);
  local_80[0] = MOV;
  local_88[1] = 10;
  local_88[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_80,local_88 + 1,local_88);
  local_80[0] = AND;
  local_88[1] = 10;
  local_88[0] = NUMBER;
  local_74 = DL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_80,local_88 + 1,local_88,(int *)&local_74);
  local_80[0] = CMP;
  local_88[1] = 10;
  local_88[0] = NUMBER;
  local_74 = BL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_80,local_88 + 1,local_88,(int *)&local_74);
  local_80[0] = JNES;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_80,&local_30);
  local_80[0] = MOV;
  local_88[1] = 9;
  local_88[0] = NUMBER;
  local_74 = RSP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_80,local_88 + 1,local_88,(int *)&local_74);
  local_80[0] = JMPS;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_80,&local_50);
  local_80[0] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_80,&local_30);
  jump_short_if_arg_is_not_block(code,RAX,RBX,&local_70);
  local_88[1] = 2;
  local_88[0] = RAX;
  local_74 = NUMBER;
  local_80[0] = ~CMPLTPD;
  local_80[1] = ~ADD;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_88 + 1,local_88,&local_74,(unsigned_long *)local_80);
  jump_short_if_arg_does_not_point_to_closure(code,RAX,RAX,&local_70);
  local_80[0] = MOV;
  local_88[1] = 9;
  local_88[0] = NUMBER;
  local_74 = RSP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_80,local_88 + 1,local_88,(int *)&local_74);
  local_80[0] = JMPS;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_80,&local_50);
  local_80[0] = LABEL;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_80,&local_70);
  local_80[0] = MOV;
  local_88[1] = 9;
  local_88[0] = NUMBER;
  local_74 = DL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_80,local_88 + 1,local_88,(int *)&local_74);
  local_80[0] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_80,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void inline_is_procedure(ASM::asmcode& code, const compiler_options&)
  {
  auto done = label_to_string(label++);
  auto check_closure = label_to_string(label++);
  auto lab_false = label_to_string(label++);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RBX, ASM::asmcode::RAX);
  code.add(ASM::asmcode::AND, ASM::asmcode::RBX, ASM::asmcode::NUMBER, procedure_mask);
  code.add(ASM::asmcode::CMP, ASM::asmcode::RBX, ASM::asmcode::NUMBER, procedure_tag);
  code.add(ASM::asmcode::JNES, check_closure);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, bool_t);
  code.add(ASM::asmcode::JMPS, done);
  code.add(ASM::asmcode::LABEL, check_closure);
  jump_short_if_arg_is_not_block(code, ASM::asmcode::RAX, ASM::asmcode::RBX, lab_false);
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  jump_short_if_arg_does_not_point_to_closure(code, ASM::asmcode::RAX, ASM::asmcode::RAX, lab_false);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, bool_t);
  code.add(ASM::asmcode::JMPS, done);
  code.add(ASM::asmcode::LABEL, lab_false);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, bool_f);
  code.add(ASM::asmcode::LABEL, done);
  }